

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enummanager.cpp
# Opt level: O1

Enum * __thiscall camp::detail::EnumManager::addClass(EnumManager *this,string *name,string *id)

{
  type *this_00;
  _Alloc_hider _Var1;
  iterator iVar2;
  iterator iVar3;
  Enum *this_01;
  EnumAlreadyCreated *__return_storage_ptr__;
  shared_ptr<camp::Enum> newEnum;
  EnumInfo info;
  string local_e8;
  string local_c8;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  Enum *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  EnumAlreadyCreated local_78;
  
  this_00 = &(this->m_enums).super_type;
  iVar2 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<1,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Id,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)this_00,id);
  if (iVar2.node ==
      (this->m_enums).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
      .member) {
    iVar3 = boost::multi_index::detail::
            ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
            ::find<std::__cxx11::string>
                      ((ordered_index_impl<boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,camp::detail::EnumManager::EnumInfo,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::id>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::detail::EnumManager::EnumInfo,std::__cxx11::string,&camp::detail::EnumManager::EnumInfo::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::detail::EnumManager::EnumInfo>>,boost::mpl::v_item<camp::detail::EnumManager::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                        *)this_00,name);
    if ((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>
         *)iVar3.node ==
        (this->m_enums).
        super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::detail::EnumManager::EnumInfo,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>_>_*,_boost::multi_index::multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>_>
        .member) {
      this_01 = (Enum *)operator_new(0x68);
      Enum::Enum(this_01,name);
      local_e8._M_dataplus._M_p = (pointer)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<camp::Enum*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length,this_01);
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_a0 = 0;
      local_98[0] = 0;
      local_88 = (Enum *)0x0;
      _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_a8 = local_98;
      std::__cxx11::string::_M_assign((string *)&local_c8);
      std::__cxx11::string::_M_assign((string *)&local_a8);
      local_88 = (Enum *)local_e8._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_80,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length
                );
      boost::multi_index::
      multi_index_container<camp::detail::EnumManager::EnumInfo,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::id>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::detail::EnumManager::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::detail::EnumManager::EnumInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::detail::EnumManager::EnumInfo::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::detail::EnumManager::EnumInfo>_>
      ::insert_<boost::multi_index::detail::lvalue_tag>(&this->m_enums,&local_c8);
      ObserverNotifier::notifyEnumAdded
                (&this->super_ObserverNotifier,(Enum *)local_e8._M_dataplus._M_p);
      _Var1._M_p = local_e8._M_dataplus._M_p;
      if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
      }
      return (Enum *)_Var1._M_p;
    }
  }
  __return_storage_ptr__ = (EnumAlreadyCreated *)__cxa_allocate_exception(0x48);
  EnumAlreadyCreated::EnumAlreadyCreated(&local_78,name,id);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enummanager.cpp"
             ,"");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "Enum &camp::detail::EnumManager::addClass(const std::string &, const std::string &)",
             "");
  Error::prepare<camp::EnumAlreadyCreated>
            (__return_storage_ptr__,&local_78,&local_c8,0x38,&local_e8);
  __cxa_throw(__return_storage_ptr__,&EnumAlreadyCreated::typeinfo,Error::~Error);
}

Assistant:

Enum& EnumManager::addClass(const std::string& name, const std::string& id)
{
    const IdIndex&   ids   = m_enums.get<Id>();
    const NameIndex& names = m_enums.get<Name>();

    // First make sure that the enum doesn't already exist
    if ((ids.find(id) != ids.end()) || (names.find(name) != names.end()))
        CAMP_ERROR(EnumAlreadyCreated(name, id));

    // Create the new class
    std::shared_ptr<Enum> newEnum(new Enum(name));

    // Insert it into the table
    EnumInfo info;
    info.id = id;
    info.name = name;
    info.enumPtr = newEnum;
    m_enums.insert(info);

    // Notify observers
    notifyEnumAdded(*newEnum);

    return *newEnum;
}